

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::FlattenParameter::MergeFrom(FlattenParameter *this,Message *from)

{
  LogMessage *other;
  FlattenParameter *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if ((FlattenParameter *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0x68c1);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  from_00 = (FlattenParameter *)
            __dynamic_cast(from,&google::protobuf::Message::typeinfo,&typeinfo,0);
  if (from_00 == (FlattenParameter *)0x0) {
    google::protobuf::internal::ReflectionOps::Merge(from,&this->super_Message);
  }
  else {
    MergeFrom(this,from_00);
  }
  return;
}

Assistant:

void FlattenParameter::MergeFrom(const ::google::protobuf::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:caffe.FlattenParameter)
  GOOGLE_DCHECK_NE(&from, this);
  const FlattenParameter* source =
      ::google::protobuf::internal::DynamicCastToGenerated<const FlattenParameter>(
          &from);
  if (source == NULL) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:caffe.FlattenParameter)
    ::google::protobuf::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:caffe.FlattenParameter)
    MergeFrom(*source);
  }
}